

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluHashTableCheck(If_Man_t *p)

{
  void **t;
  void *pvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  void **ppvVar5;
  
  for (lVar4 = 0; lVar4 < p->nTableSize[1]; lVar4 = lVar4 + 1) {
    ppvVar5 = p->pHashTable[1] + lVar4;
    while (ppvVar5 = (void **)*ppvVar5, ppvVar5 != (void **)0x0) {
      pvVar1 = ppvVar5[1];
      t = ppvVar5 + 2;
      iVar2 = If_CluSupportSize((word *)t,0xd);
      uVar3 = If_CutPerformCheck16((If_Man_t *)0x0,(uint *)t,0xd,iVar2,"555");
      if (uVar3 != (((ulong)pvVar1 & 0xf) != 0)) {
        Kit_DsdPrintFromTruth((uint *)t,0xd);
        putchar(10);
        iVar2 = If_CluSupportSize((word *)t,0xd);
        If_CutPerformCheck16((If_Man_t *)0x0,(uint *)t,0xd,iVar2,"555");
        puts("Hash table problem!!!");
      }
    }
  }
  return;
}

Assistant:

void If_CluHashTableCheck( If_Man_t * p )
{
    int t = 1;
    If_Hte_t * pEntry;
    int i, RetValue, Status;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {        
            Status = ((pEntry->Group & 15) > 0);
            RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
            if ( RetValue != Status ) 
            {
                Kit_DsdPrintFromTruth( (unsigned*)pEntry->pTruth, 13 ); printf( "\n" );
                RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
                printf( "Hash table problem!!!\n" );
            }
        }
    }
}